

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

HRESULT __thiscall
Js::DebugDocument::SetBreakPoint(DebugDocument *this,int32 ibos,BREAKPOINT_STATE breakpointState)

{
  StatementLocation statement_00;
  BOOL BVar1;
  ulong uVar2;
  undefined1 local_40 [8];
  StatementLocation statement;
  ScriptContext *scriptContext;
  BREAKPOINT_STATE breakpointState_local;
  int32 ibos_local;
  DebugDocument *this_local;
  
  statement.bytecodeSpan = (Interval)Utf8SourceInfo::GetScriptContext(this->utf8SourceInfo);
  if ((statement.bytecodeSpan != (Interval)0x0) &&
     (uVar2 = (**(code **)(*(long *)statement.bytecodeSpan + 0x120))(), (uVar2 & 1) == 0)) {
    StatementLocation::StatementLocation((StatementLocation *)local_40);
    BVar1 = GetStatementLocation(this,ibos,(StatementLocation *)local_40);
    if (BVar1 == 0) {
      return -0x7fffbffb;
    }
    statement_00.statement = (Interval)statement.function;
    statement_00.function = (FunctionBody *)local_40;
    statement_00.bytecodeSpan = statement.statement;
    SetBreakPoint(this,statement_00,breakpointState);
    return 0;
  }
  return -0x7fff0001;
}

Assistant:

HRESULT DebugDocument::SetBreakPoint(int32 ibos, BREAKPOINT_STATE breakpointState)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();

        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return E_UNEXPECTED;
        }

        StatementLocation statement;
        if (!this->GetStatementLocation(ibos, &statement))
        {
            return E_FAIL;
        }

        this->SetBreakPoint(statement, breakpointState);

        return S_OK;
    }